

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall String::trim(String *this,char *chars)

{
  char *pcVar1;
  String local_60;
  usize local_38;
  size_t newLen;
  char *end;
  char *p;
  char *start;
  char *chars_local;
  String *this_local;
  
  if (this->data->len != 0) {
    end = this->data->str;
    newLen = (size_t)(end + this->data->len);
    p = end;
    start = chars;
    chars_local = (char *)this;
    while ((end < newLen && (pcVar1 = strchr(start,(int)*end), pcVar1 != (char *)0x0))) {
      end = end + 1;
    }
    do {
      newLen = newLen - 1;
      if (newLen <= end) break;
      pcVar1 = strchr(start,(int)*(char *)newLen);
    } while (pcVar1 != (char *)0x0);
    newLen = newLen + 1;
    local_38 = newLen - (long)end;
    if (local_38 != this->data->len) {
      substr(&local_60,this,(long)end - (long)p,local_38);
      operator=(this,&local_60);
      ~String(&local_60);
    }
  }
  return this;
}

Assistant:

String& String::trim(const char* chars)
{
  if(data->len)
  {
    const char* start = data->str;
    const char* p = start;
    const char* end = start + data->len;
    for(; p < end; ++p)
      if(!strchr(chars, *p))
        break;
    --end;
    for(; end > p; --end)
      if(!strchr(chars, *end))
        break;
    ++end;
    size_t newLen = end - p;
    if(newLen != data->len)
      *this = substr(p - start, newLen);
  }
  return *this;
}